

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void * __thiscall QGuiApplication::resolveInterface(QGuiApplication *this,char *name,int revision)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  QDebug *pQVar4;
  QPlatformNativeInterface *pQVar5;
  pointer_____offset_0x10___ *ppuVar6;
  long in_FS_OFFSET;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  char local_48 [24];
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
    local_30 = *(undefined8 *)(lVar2 + 8);
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    QMessageLogger::debug
              (local_48,"Comparing requested interface name %s with available %s",name,
               "QX11Application");
  }
  iVar1 = qstrcmp(name,"QX11Application");
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if (iVar1 == 0) {
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug
                (local_48,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if (revision != 1) goto LAB_002b1911;
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_60,"Full match. Returning dynamic cast of");
      local_58.stream = pQVar4->stream;
      (local_58.stream)->ref = (local_58.stream)->ref + 1;
      platformNativeInterface();
      ::operator<<((QDebug *)&local_50,(QObject *)&local_58);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
    }
    pQVar5 = platformNativeInterface();
    if (pQVar5 != (QPlatformNativeInterface *)0x0) {
      ppuVar6 = &QNativeInterface::QX11Application::typeinfo;
      goto LAB_002b1901;
    }
  }
  else {
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug(local_48,"No match for requested interface name %s",name);
    }
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug
                (local_48,"Comparing requested interface name %s with available %s",name,
                 "QWaylandApplication");
    }
    iVar1 = qstrcmp(name,"QWaylandApplication");
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if (iVar1 != 0) {
      if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
        local_30 = *(undefined8 *)(lVar2 + 8);
        local_48[0] = '\x02';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        QMessageLogger::debug(local_48,"No match for requested interface name %s",name);
      }
      pvVar3 = (void *)QCoreApplication::resolveInterface((char *)this,(int)name);
      goto LAB_002b191c;
    }
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug
                (local_48,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if (revision == 1) {
      if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
        local_30 = *(undefined8 *)(lVar2 + 8);
        local_48[0] = '\x02';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(&local_60,"Full match. Returning dynamic cast of");
        local_70.stream = pQVar4->stream;
        (local_70.stream)->ref = (local_70.stream)->ref + 1;
        platformNativeInterface();
        ::operator<<((QDebug *)&local_68,(QObject *)&local_70);
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug(&local_70);
        QDebug::~QDebug(&local_60);
      }
      pQVar5 = platformNativeInterface();
      if (pQVar5 == (QPlatformNativeInterface *)0x0) goto LAB_002b1919;
      ppuVar6 = &QNativeInterface::QWaylandApplication::typeinfo;
LAB_002b1901:
      pvVar3 = (void *)__dynamic_cast(pQVar5,&QPlatformNativeInterface::typeinfo,ppuVar6,
                                      0xfffffffffffffffe);
      goto LAB_002b191c;
    }
LAB_002b1911:
    if ((*(byte *)(lVar2 + 0x11) & 1) != 0) {
      local_30 = *(undefined8 *)(lVar2 + 8);
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      pvVar3 = (void *)0x0;
      QMessageLogger::warning
                (local_48,
                 "Native interface revision mismatch (requested %d / available %d) for interface %s"
                 ,(ulong)(uint)revision,1,name);
      goto LAB_002b191c;
    }
  }
LAB_002b1919:
  pvVar3 = (void *)0x0;
LAB_002b191c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pvVar3;
}

Assistant:

void *QGuiApplication::resolveInterface(const char *name, int revision) const
{
    using namespace QNativeInterface;
    using namespace QNativeInterface::Private;

    auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    Q_UNUSED(platformIntegration);

#if defined(Q_OS_WIN)
    QT_NATIVE_INTERFACE_RETURN_IF(QWindowsApplication, platformIntegration);
#endif
#if QT_CONFIG(xcb)
    QT_NATIVE_INTERFACE_RETURN_IF(QX11Application, platformNativeInterface());
#endif
#if QT_CONFIG(wayland)
    QT_NATIVE_INTERFACE_RETURN_IF(QWaylandApplication, platformNativeInterface());
#endif
#if defined(Q_OS_VISIONOS)
    QT_NATIVE_INTERFACE_RETURN_IF(QVisionOSApplication, platformIntegration);
#endif

    return QCoreApplication::resolveInterface(name, revision);
}